

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

void __thiscall google::protobuf::FieldOptions::SharedCtor(FieldOptions *this,Arena *arena)

{
  Impl_::Impl_((Impl_ *)&this->field_0);
  *(undefined8 *)((long)&this->field_0 + 0x70) = 0;
  *(undefined8 *)((long)&this->field_0 + 0x78) = 0;
  (this->field_0)._impl_.features_ = (FeatureSet *)0x0;
  (this->field_0)._impl_.feature_support_ = (FieldOptions_FeatureSupport *)0x0;
  (this->field_0)._impl_.retention_ = 0;
  return;
}

Assistant:

inline void FieldOptions::SharedCtor(::_pb::Arena* PROTOBUF_NULLABLE arena) {
  new (&_impl_) Impl_(internal_visibility(), arena);
  ::memset(reinterpret_cast<char *>(&_impl_) +
               offsetof(Impl_, features_),
           0,
           offsetof(Impl_, retention_) -
               offsetof(Impl_, features_) +
               sizeof(Impl_::retention_));
}